

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aspa.c
# Opt level: O0

int custom_recv(tr_socket *socket,void *buf,size_t len,time_t timeout)

{
  long lVar1;
  long in_FS_OFFSET;
  size_t local_38;
  size_t rlen;
  time_t timeout_local;
  size_t len_local;
  void *buf_local;
  tr_socket *socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = len;
  if (data_size < data_index + len) {
    local_38 = data_size - data_index;
  }
  memcpy(buf,data + data_index,local_38);
  data_index = data_index + local_38;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)local_38;
  }
  __stack_chk_fail();
}

Assistant:

static int custom_recv(const struct tr_socket *socket __attribute__((unused)), const void *buf, const size_t len,
		       const time_t timeout __attribute__((unused)))
{
	size_t rlen = len;

	if (data_index + rlen > data_size)
		rlen = data_size - data_index;

	memcpy((char *)buf, data + data_index, rlen);
	data_index += rlen;
	return rlen;
}